

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t union_uint16(uint16_t *set_1,size_t size_1,uint16_t *set_2,size_t size_2,uint16_t *buffer)

{
  ulong uVar1;
  size_t n_elems_1;
  size_t n_elems;
  uint16_t val_2;
  ulong uStack_50;
  uint16_t val_1;
  size_t idx_2;
  size_t idx_1;
  size_t pos;
  uint16_t *buffer_local;
  size_t size_2_local;
  uint16_t *set_2_local;
  size_t size_1_local;
  uint16_t *set_1_local;
  
  idx_1 = 0;
  idx_2 = 0;
  uStack_50 = 0;
  if (size_2 == 0) {
    memmove(buffer,set_1,size_1 << 1);
    set_1_local = (uint16_t *)size_1;
  }
  else {
    if (size_1 != 0) {
      n_elems._6_2_ = *set_1;
      n_elems._4_2_ = *set_2;
      do {
        if (n_elems._6_2_ < n_elems._4_2_) {
          buffer[idx_1] = n_elems._6_2_;
          idx_2 = idx_2 + 1;
          uVar1 = uStack_50;
          if (size_1 <= idx_2) goto LAB_00103ba1;
          n_elems._6_2_ = set_1[idx_2];
        }
        else {
          if (n_elems._4_2_ < n_elems._6_2_) {
            buffer[idx_1] = n_elems._4_2_;
            uVar1 = uStack_50 + 1;
            if (size_2 <= uVar1) goto LAB_00103ba1;
            n_elems._4_2_ = set_2[uVar1];
          }
          else {
            buffer[idx_1] = n_elems._6_2_;
            idx_2 = idx_2 + 1;
            uVar1 = uStack_50 + 1;
            if ((size_1 <= idx_2) || (size_2 <= uVar1)) {
LAB_00103ba1:
              uStack_50 = uVar1;
              idx_1 = idx_1 + 1;
              if (idx_2 < size_1) {
                memmove(buffer + idx_1,set_1 + idx_2,(size_1 - idx_2) * 2);
                idx_1 = (size_1 - idx_2) + idx_1;
              }
              else if (uStack_50 < size_2) {
                memmove(buffer + idx_1,set_2 + uStack_50,(size_2 - uStack_50) * 2);
                idx_1 = (size_2 - uStack_50) + idx_1;
              }
              return idx_1;
            }
            n_elems._6_2_ = set_1[idx_2];
            n_elems._4_2_ = set_2[uVar1];
          }
          uStack_50 = uStack_50 + 1;
        }
        idx_1 = idx_1 + 1;
      } while( true );
    }
    memmove(buffer,set_2,size_2 << 1);
    set_1_local = (uint16_t *)size_2;
  }
  return (size_t)set_1_local;
}

Assistant:

size_t union_uint16(const uint16_t *set_1, size_t size_1, const uint16_t *set_2,
                    size_t size_2, uint16_t *buffer) {
    size_t pos = 0, idx_1 = 0, idx_2 = 0;

    if (0 == size_2) {
        memmove(buffer, set_1, size_1 * sizeof(uint16_t));
        return size_1;
    }
    if (0 == size_1) {
        memmove(buffer, set_2, size_2 * sizeof(uint16_t));
        return size_2;
    }

    uint16_t val_1 = set_1[idx_1], val_2 = set_2[idx_2];

    while (true) {
        if (val_1 < val_2) {
            buffer[pos++] = val_1;
            ++idx_1;
            if (idx_1 >= size_1) break;
            val_1 = set_1[idx_1];
        } else if (val_2 < val_1) {
            buffer[pos++] = val_2;
            ++idx_2;
            if (idx_2 >= size_2) break;
            val_2 = set_2[idx_2];
        } else {
            buffer[pos++] = val_1;
            ++idx_1;
            ++idx_2;
            if (idx_1 >= size_1 || idx_2 >= size_2) break;
            val_1 = set_1[idx_1];
            val_2 = set_2[idx_2];
        }
    }

    if (idx_1 < size_1) {
        const size_t n_elems = size_1 - idx_1;
        memmove(buffer + pos, set_1 + idx_1, n_elems * sizeof(uint16_t));
        pos += n_elems;
    } else if (idx_2 < size_2) {
        const size_t n_elems = size_2 - idx_2;
        memmove(buffer + pos, set_2 + idx_2, n_elems * sizeof(uint16_t));
        pos += n_elems;
    }

    return pos;
}